

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::PrepareProgram
          (AttributeFormatTest *this,GLint size,AtributeFormatFunctionType function_selector)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  int *piVar9;
  undefined4 *puVar10;
  MessageBuilder *pMVar11;
  bool bVar12;
  int *piVar13;
  undefined **ppuVar14;
  GLint status_1;
  GLint status;
  GLint log_size;
  GLchar *log_text_1;
  int local_22c;
  undefined8 local_228;
  int local_21c;
  Enum<int,_2UL> local_218;
  undefined *local_208;
  undefined8 local_200;
  undefined *local_1f8;
  undefined8 local_1f0;
  int local_1e8 [2];
  undefined *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  int local_1c0 [4];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar8;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  piVar13 = local_1e8;
  local_208 = s_vertex_shader_head;
  local_200 = *(undefined8 *)
               (s_vertex_shader_declaration +
               (long)(size + -1) * 8 + (ulong)function_selector * 0x20);
  local_1f8 = s_vertex_shader_body;
  local_1f0 = 0x8b3100000003;
  local_1e8[0] = 0;
  local_1e0 = s_fragment_shader;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1c8 = 0x8b3000000001;
  local_1c0[0] = 0;
  GVar5 = (**(code **)(lVar8 + 0x3c8))();
  this->m_po = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x7b3);
  ppuVar14 = &local_208;
  bVar3 = true;
  do {
    bVar12 = bVar3;
    uVar7 = (**(code **)(lVar8 + 0x3f0))(*(undefined4 *)((long)ppuVar14 + 0x1c));
    *(undefined4 *)(ppuVar14 + 4) = uVar7;
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCreateShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x7bc);
    (**(code **)(lVar8 + 0x10))(this->m_po,*(undefined4 *)(ppuVar14 + 4));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glAttachShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x7c0);
    (**(code **)(lVar8 + 0x12b8))
              (*(undefined4 *)(ppuVar14 + 4),*(undefined4 *)(ppuVar14 + 3),ppuVar14,0);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glShaderSource call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x7c4);
    (**(code **)(lVar8 + 0x248))(*(undefined4 *)(ppuVar14 + 4));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCompileShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x7c8);
    local_22c = 0;
    (**(code **)(lVar8 + 0xa70))(*(undefined4 *)(ppuVar14 + 4),0x8b81,&local_22c);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetShaderiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x7cd);
    if (local_22c == 0) {
      local_21c = 0;
      (**(code **)(lVar8 + 0xa70))(*(undefined4 *)(ppuVar14 + 4),0x8b84);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x7d3);
      iVar4 = local_21c;
      local_228 = (char *)operator_new__((long)local_21c);
      (**(code **)(lVar8 + 0xa58))(*(undefined4 *)(ppuVar14 + 4),iVar4,0,local_228);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Shader compilation has failed.\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Shader type: ",0xd);
      local_218.m_value = *(int *)((long)ppuVar14 + 0x1c);
      local_218.m_getName = glu::getShaderTypeName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_218,(ostream *)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Shader compilation error log:\n",0x1e);
      pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_228);
      poVar1 = &pMVar11->m_str;
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Shader source code:\n"
                 ,0x14);
      std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      if (local_228 != (char *)0x0) {
        operator_delete__(local_228);
      }
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x7e4);
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    ppuVar14 = &local_1e0;
    bVar3 = false;
  } while (bVar12);
  (**(code **)(lVar8 + 0x14c8))(this->m_po,1,&PrepareProgram::xfb_varying,0x8c8c);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x7ef);
  (**(code **)(lVar8 + 0xce8))(this->m_po);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x7f4);
  local_228 = (char *)((ulong)local_228._4_4_ << 0x20);
  (**(code **)(lVar8 + 0x9d8))(this->m_po,0x8b82);
  if ((int)local_228 == 1) {
    piVar9 = piVar13;
    bVar3 = true;
    do {
      bVar12 = bVar3;
      if (*piVar9 != 0) {
        (**(code **)(lVar8 + 0x4e0))(this->m_po);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x802);
      }
      piVar9 = local_1c0;
      bVar3 = false;
    } while (bVar12);
    bVar3 = true;
    do {
      bVar12 = bVar3;
      if (*piVar13 != 0) {
        (**(code **)(lVar8 + 0x470))();
        *piVar13 = 0;
      }
      piVar13 = local_1c0;
      bVar3 = false;
    } while (bVar12);
    if (this->m_po != 0) {
      return;
    }
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  local_22c = 0;
  (**(code **)(lVar8 + 0x9d8))(this->m_po,0x8b84);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x80c);
  iVar4 = local_22c;
  local_218.m_getName = (GetNameFunc)operator_new__((long)local_22c);
  (**(code **)(lVar8 + 0x988))(this->m_po,iVar4,0,local_218.m_getName);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Program linkage has failed due to:\n",0x23);
  pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_218);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (local_218.m_getName != (GetNameFunc)0x0) {
    operator_delete__(local_218.m_getName);
  }
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x818);
  puVar10 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar10 = 0;
  __cxa_throw(puVar10,&int::typeinfo,0);
}

Assistant:

void AttributeFormatTest::PrepareProgram(glw::GLint size, AtributeFormatFunctionType function_selector)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* source[3];
		glw::GLuint const  count;
		glw::GLenum const  type;
		glw::GLuint		   id;
	} shader[] = { { { s_vertex_shader_head, s_vertex_shader_declaration[function_selector][size - 1],
					   s_vertex_shader_body },
					 3,
					 GL_VERTEX_SHADER,
					 0 },
				   { { s_fragment_shader, DE_NULL, DE_NULL }, 1, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, shader[i].count, shader[i].source, NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
														<< "Shader type: " << glu::getShaderTypeStr(shader[i].type)
														<< "\n"
														<< "Shader compilation error log:\n"
														<< log_text << "\n"
														<< "Shader source code:\n"
														<< shader[i].source << "\n"
														<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Transform Feedback setup. */
		static const glw::GLchar* xfb_varying = "result";

		gl.transformFeedbackVaryings(m_po, 1, &xfb_varying, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == m_po)
	{
		throw 0;
	}
}